

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O1

ByteArray<1UL> __thiscall
supermap::io::DeserializeHelper<supermap::ByteArray<1UL>,_void>::deserialize
          (DeserializeHelper<supermap::ByteArray<1UL>,_void> *this,istream *is)

{
  undefined1 *puVar1;
  IOException *this_00;
  long *plVar2;
  size_type *psVar3;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (undefined1 *)operator_new__(1);
  *puVar1 = 0;
  *(undefined1 **)this = puVar1;
  std::istream::read((char *)is,(long)puVar1);
  if (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    return (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_90,1);
  std::operator+(&local_70,"Unsuccessful deserialization, expected to read ",&local_90);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_b0,*(long *)(is + 8));
  std::operator+(&local_50,&local_d0,&local_b0);
  supermap::IOException::IOException(this_00,(string *)&local_50);
  __cxa_throw(this_00,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static ByteArray<Len> deserialize(std::istream &is) {
        ByteArray<Len> ar;
        is.read(ar.getCharsPointer(), Len);
        if (!is.good()) {
            throw IOException(
                "Unsuccessful deserialization, expected to read " + std::to_string(Len) +
                    " bytes, but read only " + std::to_string(is.gcount()));
        }
        return ar;
    }